

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

DiffuseAreaLight *
pbrt::DiffuseAreaLight::Create
          (Transform *renderFromLight,MediumHandle *medium,ParameterDictionary *parameters,
          RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc,ShapeHandle shape)

{
  Float (*paFVar1) [3];
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar2;
  float fVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  undefined7 extraout_var;
  RGBColorSpace *pRVar6;
  int iVar7;
  undefined4 extraout_var_00;
  long lVar8;
  int c;
  int iVar9;
  float *pfVar10;
  undefined4 uVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  long *plVar13;
  size_t *psVar14;
  ulong uVar15;
  Float FVar16;
  float fVar17;
  undefined1 extraout_var_01 [60];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  bool twoSided;
  Float local_3e0;
  Float scale;
  undefined4 local_3d8;
  Float local_3d4;
  SpectrumHandle L;
  RGBColorSpace *imageColorSpace;
  FileLoc *local_398;
  FileLoc *pFStack_390;
  memory_resource *local_380;
  Transform *local_378;
  RGBColorSpace *local_370;
  string filename;
  Allocator alloc_local;
  Image image;
  ImageAndMetadata im;
  ImageChannelDesc channelDesc_1;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_e0;
  undefined1 local_d8 [8];
  long *local_d0 [2];
  long local_c0;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_b8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_98;
  SpectrumHandle local_78;
  ColorEncodingHandle local_70;
  undefined8 local_68;
  ImageChannelDesc channelDesc;
  
  pvVar12 = &im.image.channelNames;
  pFStack_390 = local_398;
  local_398 = loc;
  alloc_local = alloc;
  im.image._0_8_ = pvVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&im,"L","");
  local_68 = 0;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)&L,(string *)parameters,(SpectrumHandle *)&im,
             (SpectrumType)&local_68,(Allocator)0x2);
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)im.image._0_8_ != pvVar12) {
    operator_delete((void *)im.image._0_8_,
                    (ulong)((long)&(im.image.channelNames.alloc.memoryResource)->
                                   _vptr_memory_resource + 1));
  }
  im.image._0_8_ = pvVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&im,"scale","");
  local_3e0 = ParameterDictionary::GetOneFloat(parameters,(string *)&im,1.0);
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)im.image._0_8_ != pvVar12) {
    operator_delete((void *)im.image._0_8_,
                    (ulong)((long)&(im.image.channelNames.alloc.memoryResource)->
                                   _vptr_memory_resource + 1));
  }
  scale = local_3e0;
  im.image._0_8_ = pvVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&im,"twosided","");
  twoSided = ParameterDictionary::GetOneBool(parameters,(string *)&im,false);
  local_378 = renderFromLight;
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)im.image._0_8_ != pvVar12) {
    operator_delete((void *)im.image._0_8_,
                    (ulong)((long)&(im.image.channelNames.alloc.memoryResource)->
                                   _vptr_memory_resource + 1));
  }
  local_3d8 = (undefined4)CONCAT71(extraout_var,twoSided);
  image._0_8_ = &image.channelNames;
  std::__cxx11::string::_M_construct<char_const*>((string *)&image,"filename","");
  paVar2 = &channelDesc_1.offset.field_2;
  channelDesc_1.offset.alloc.memoryResource = (memory_resource *)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&channelDesc_1,"");
  ParameterDictionary::GetOneString
            ((string *)&im,parameters,(string *)&image,(string *)&channelDesc_1);
  ResolveFilename(&filename,(string *)&im);
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)im.image._0_8_ != pvVar12) {
    operator_delete((void *)im.image._0_8_,
                    (ulong)((long)&(im.image.channelNames.alloc.memoryResource)->
                                   _vptr_memory_resource + 1));
  }
  if ((anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
       *)channelDesc_1.offset.alloc.memoryResource != paVar2) {
    operator_delete(channelDesc_1.offset.alloc.memoryResource,channelDesc_1.offset.field_2._0_8_ + 1
                   );
  }
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)image._0_8_ != &image.channelNames) {
    operator_delete((void *)image._0_8_,
                    (ulong)((long)&(image.channelNames.alloc.memoryResource)->_vptr_memory_resource
                           + 1));
  }
  image.format = U256;
  image.resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  image.resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  image.channelNames.alloc.memoryResource = pstd::pmr::new_delete_resource();
  imageColorSpace = (RGBColorSpace *)0x0;
  image.channelNames.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  image.channelNames.nAlloc = 0;
  image.channelNames.nStored = 0;
  image.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  image.p8._8_16_ = ZEXT416(0) << 0x40;
  image.p8.nStored = 0;
  image.p16.nStored = 0;
  image.p32.nStored = 0;
  image.p8.alloc.memoryResource = alloc.memoryResource;
  image.p16.alloc.memoryResource = alloc.memoryResource;
  image.p16._8_16_ = image.p8._8_16_;
  image.p32.alloc.memoryResource = alloc.memoryResource;
  image.p32._8_16_ = image.p8._8_16_;
  if (filename._M_string_length == 0) {
    if (L.
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits == 0) {
      L.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )((ulong)&colorSpace->illuminant | 0x2000000000000);
    }
    pRVar6 = (RGBColorSpace *)0x0;
  }
  else {
    if (L.
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits != 0) {
      ErrorExit(local_398,"Both \"L\" and \"filename\" specified for DiffuseAreaLight.");
    }
    local_70.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    Image::Read(&im,&filename,alloc,&local_70);
    channelDesc_1.offset.alloc.memoryResource = (memory_resource *)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&channelDesc_1,"R","");
    channelDesc_1.offset.nAlloc = (size_t)&local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&channelDesc_1.offset.nAlloc,"G","");
    plVar13 = &local_c0;
    local_d0[0] = plVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"B","");
    requestedChannels.n = 3;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&channelDesc_1;
    Image::GetChannelDesc(&channelDesc,&im.image,requestedChannels);
    lVar8 = -0x60;
    do {
      if (plVar13 != (long *)plVar13[-2]) {
        operator_delete((long *)plVar13[-2],*plVar13 + 1);
      }
      plVar13 = plVar13 + -4;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0);
    if (channelDesc.offset.nStored == 0) {
      ErrorExit<std::__cxx11::string&>
                (local_398,
                 "%s: Image provided to \"diffuse\" area light must have R, G, and B channels.",
                 &filename);
    }
    Image::SelectChannels((Image *)&channelDesc_1,&im.image,&channelDesc,alloc);
    paVar2 = &channelDesc_1.offset.field_2;
    image.resolution.super_Tuple2<pbrt::Point2,_int>.y = (int)channelDesc_1.offset.ptr;
    image.format = (PixelFormat)channelDesc_1.offset.alloc.memoryResource;
    image.resolution.super_Tuple2<pbrt::Point2,_int>.x =
         (int)((ulong)channelDesc_1.offset.alloc.memoryResource >> 0x20);
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&image.channelNames,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)paVar2);
    image.encoding.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )local_e0.bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&image.p8,
               (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)local_d8);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&image.p16,&local_b8);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(&image.p32,&local_98);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_98);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_b8);
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)local_d8);
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)paVar2);
    pRVar6 = ImageMetadata::GetColorSpace(&im.metadata);
    imageColorSpace = pRVar6;
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              (&channelDesc.offset);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&im.metadata.stringVectors._M_t);
    if (im.metadata.colorSpace.set == true) {
      im.metadata.colorSpace.set = false;
    }
    if (im.metadata.MSE.set == true) {
      im.metadata.MSE.set = false;
    }
    if (im.metadata.samplesPerPixel.set == true) {
      im.metadata.samplesPerPixel.set = false;
    }
    if (im.metadata.fullResolution.set == true) {
      im.metadata.fullResolution.set = false;
    }
    if (im.metadata.pixelBounds.set == true) {
      im.metadata.pixelBounds.set = false;
    }
    if (im.metadata.NDCFromWorld.set == true) {
      im.metadata.NDCFromWorld.set = false;
    }
    if (im.metadata.cameraFromWorld.set == true) {
      im.metadata.cameraFromWorld.set = false;
    }
    if (im.metadata.renderTimeSeconds.set == true) {
      im.metadata.renderTimeSeconds.set = false;
    }
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&im.image.p32);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&im.image.p16);
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
              (&im.image.p8);
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&im.image.channelNames);
  }
  pvVar12 = &im.image.channelNames;
  local_78.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )((ulong)&colorSpace->illuminant | 0x2000000000000);
  if (((ulong)L.
              super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
              .bits & 0xffffffffffff) != 0) {
    local_78.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = L.
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
            .bits;
  }
  FVar16 = SpectrumToPhotometric(&local_78);
  fVar17 = local_3e0 / FVar16;
  scale = fVar17;
  im.image._0_8_ = pvVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)&im,"power","");
  local_3d4 = ParameterDictionary::GetOneFloat(parameters,(string *)&im,-1.0);
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)im.image._0_8_ != pvVar12) {
    operator_delete((void *)im.image._0_8_,
                    (ulong)((long)&(im.image.channelNames.alloc.memoryResource)->
                                   _vptr_memory_resource + 1));
  }
  if (0.0 < local_3d4) {
    paFVar1 = (pRVar6->XYZFromRGB).m + 1;
    auVar4 = *(undefined1 (*) [16])paFVar1;
    auVar19 = *(undefined1 (*) [16])paFVar1;
    FVar16 = (pRVar6->XYZFromRGB).m[1][2];
    im.image._0_8_ = pvVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&im,"R","");
    im.image.channelNames.nAlloc = (size_t)&im.image.encoding;
    std::__cxx11::string::_M_construct<char_const*>((string *)&im.image.channelNames.nAlloc,"G","");
    psVar14 = &im.image.p8.nStored;
    im.image.p8.ptr = (uchar *)psVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&im.image.p8.ptr,"B","");
    requestedChannels_00.n = 3;
    requestedChannels_00.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&im;
    Image::GetChannelDesc(&channelDesc_1,&image,requestedChannels_00);
    uVar11 = local_3d8;
    lVar8 = -0x60;
    do {
      if (psVar14 != (size_t *)psVar14[-2]) {
        operator_delete((long *)psVar14[-2],*psVar14 + 1);
      }
      psVar14 = psVar14 + -4;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0);
    if ((0 < image.resolution.super_Tuple2<pbrt::Point2,_int>.x) &&
       (0 < image.resolution.super_Tuple2<pbrt::Point2,_int>.y)) {
      iVar9 = image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
      iVar7 = image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
      if (image.resolution.super_Tuple2<pbrt::Point2,_int>.y < 1) {
        fVar18 = 0.0;
      }
      else {
        _local_398 = vmovshdup_avx(auVar19);
        auVar20 = ZEXT864(0);
        pRVar6 = (RGBColorSpace *)0x0;
        local_380 = alloc.memoryResource;
        do {
          local_370 = pRVar6;
          if (0 < iVar9) {
            uVar15 = 0;
            do {
              iVar9 = 0;
              do {
                local_3e0 = auVar20._0_4_;
                auVar20._0_4_ =
                     Image::GetChannel(&image,(Point2i)((long)pRVar6 << 0x20 | uVar15),iVar9,
                                       (WrapMode2D)0x200000002);
                auVar20._4_60_ = extraout_var_01;
                auVar19 = auVar4;
                if ((iVar9 != 0) && (auVar19 = _local_398, iVar9 != 1)) {
                  auVar19 = ZEXT416((uint)FVar16);
                }
                auVar19 = vfmadd213ss_fma(auVar19,auVar20._0_16_,ZEXT416((uint)local_3e0));
                auVar20 = ZEXT1664(auVar19);
                iVar9 = iVar9 + 1;
              } while (iVar9 != 3);
              uVar15 = uVar15 + 1;
              iVar9 = image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
              iVar7 = image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
            } while ((long)uVar15 < (long)image.resolution.super_Tuple2<pbrt::Point2,_int>.x);
          }
          fVar18 = auVar20._0_4_;
          pRVar6 = (RGBColorSpace *)((long)&(local_370->r).super_Tuple2<pbrt::Point2,_float>.x + 1);
          alloc.memoryResource = local_380;
          uVar11 = local_3d8;
        } while ((long)pRVar6 < (long)iVar7);
      }
      local_3e0 = fVar18 / (float)(iVar9 * iVar7);
    }
    uVar15 = *(ulong *)shape.
                       super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                       .bits;
    uVar5 = (uint)(ushort)(uVar15 >> 0x30);
    if (uVar15 >> 0x32 == 0) {
      if (uVar15 < 0x2000000000000) {
        pfVar10 = (float *)(uVar15 & 0xffffffffffff);
        FVar16 = pfVar10[5] * *pfVar10 * (pfVar10[2] - pfVar10[1]);
      }
      else {
        uVar15 = uVar15 & 0xffffffffffff;
        if (uVar5 == 2) {
          FVar16 = (*(float *)(uVar15 + 0x1c) - *(float *)(uVar15 + 0x18)) *
                   *(float *)(uVar15 + 0x14) * *(float *)(uVar15 + 0x20);
        }
        else {
          fVar18 = (float)*(undefined8 *)(uVar15 + 0x18);
          fVar3 = (float)((ulong)*(undefined8 *)(uVar15 + 0x18) >> 0x20);
          auVar19._0_4_ = fVar18 * fVar18;
          auVar19._4_4_ = fVar3 * fVar3;
          auVar19._8_8_ = 0;
          auVar19 = vhsubps_avx(auVar19,auVar19);
          FVar16 = *(float *)(uVar15 + 0x20) * 0.5 * auVar19._0_4_;
        }
      }
    }
    else {
      uVar5 = uVar5 - 3;
      if (uVar5 < 2) {
        FVar16 = Triangle::Area((Triangle *)(uVar15 & 0xffffffffffff));
      }
      else if (uVar5 == 2) {
        FVar16 = ((Curve *)(uVar15 & 0xffffffffffff))->uMin;
      }
      else {
        FVar16 = Curve::Area((Curve *)(uVar15 & 0xffffffffffff));
      }
    }
    scale = (local_3d4 /
            ((float)((uint)((byte)uVar11 & 1) * 0x40000000 +
                    (uint)!(bool)((byte)uVar11 & 1) * 0x3f800000) * FVar16 * 3.1415927 * local_3e0))
            * fVar17;
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              (&channelDesc_1.offset);
  }
  iVar9 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x178,8);
  pstd::pmr::polymorphic_allocator<std::byte>::
  construct<pbrt::DiffuseAreaLight,pbrt::Transform_const&,pbrt::MediumHandle&,pbrt::SpectrumHandle&,float&,pbrt::ShapeHandle_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
            (&alloc_local,(DiffuseAreaLight *)CONCAT44(extraout_var_00,iVar9),local_378,medium,&L,
             &scale,(ShapeHandle *)
                    shape.
                    super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                    .bits,&image,&imageColorSpace,&twoSided,&alloc_local);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&image.p32);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&image.p16);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector(&image.p8);
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&image.channelNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  return (DiffuseAreaLight *)CONCAT44(extraout_var_00,iVar9);
}

Assistant:

DiffuseAreaLight *DiffuseAreaLight::Create(const Transform &renderFromLight,
                                           MediumHandle medium,
                                           const ParameterDictionary &parameters,
                                           const RGBColorSpace *colorSpace,
                                           const FileLoc *loc, Allocator alloc,
                                           const ShapeHandle shape) {
    SpectrumHandle L =
        parameters.GetOneSpectrum("L", nullptr, SpectrumType::Illuminant, alloc);
    Float scale = parameters.GetOneFloat("scale", 1);
    bool twoSided = parameters.GetOneBool("twosided", false);

    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
    Image image(alloc);
    const RGBColorSpace *imageColorSpace = nullptr;
    if (!filename.empty()) {
        if (L != nullptr)
            ErrorExit(loc, "Both \"L\" and \"filename\" specified for DiffuseAreaLight.");
        ImageAndMetadata im = Image::Read(filename, alloc);

        ImageChannelDesc channelDesc = im.image.GetChannelDesc({"R", "G", "B"});
        if (!channelDesc)
            ErrorExit(loc,
                      "%s: Image provided to \"diffuse\" area light must have "
                      "R, G, and B channels.",
                      filename);
        image = im.image.SelectChannels(channelDesc, alloc);

        imageColorSpace = im.metadata.GetColorSpace();
    } else if (L == nullptr)
        L = &colorSpace->illuminant;

    // scale so that radiance is equivalent to 1 nit
    scale /= SpectrumToPhotometric(L ? L : &colorSpace->illuminant);

    Float phi_v = parameters.GetOneFloat("power", -1.0f);
    if (phi_v > 0) {
        // k_e is the emissive power of the light as defined by the spectral
        // distribution and texture and is used to normalize the emitted
        // radiance such that the user-defined power will be the actual power
        // emitted by the light.
        Float k_e;
        // Get the appropriate luminance vector from the image colour space
        RGB lum = imageColorSpace->LuminanceVector();
        // we need to know which channels correspond to R, G and B
        // we know that the channelDesc is valid as we would have exited in the
        // block above otherwise
        ImageChannelDesc channelDesc = image.GetChannelDesc({"R", "G", "B"});
        if (image) {
            k_e = 0;
            // Assume no distortion in the mapping, FWIW...
            for (int y = 0; y < image.Resolution().y; ++y)
                for (int x = 0; x < image.Resolution().x; ++x) {
                    for (int c = 0; c < 3; ++c)
                        k_e += image.GetChannel({x, y}, c) * lum[c];
                }
            k_e /= image.Resolution().x * image.Resolution().y;
        }

        k_e *= (twoSided ? 2 : 1) * shape.Area() * Pi;

        // now multiply up scale to hit the target power
        scale *= phi_v / k_e;
    }

    return alloc.new_object<DiffuseAreaLight>(renderFromLight, medium, L, scale, shape,
                                              std::move(image), imageColorSpace, twoSided,
                                              alloc);
}